

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O3

void aom_highbd_lpf_horizontal_4_dual_sse2
               (uint16_t *s,int p,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1,int bd)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  long lVar78;
  short sVar79;
  undefined1 auVar80 [16];
  short sVar81;
  undefined1 auVar82 [16];
  short sVar83;
  short sVar88;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  short sVar89;
  undefined1 auVar87 [16];
  short sVar90;
  undefined1 auVar91 [16];
  short sVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  ushort uVar104;
  ushort uVar107;
  ushort uVar108;
  ushort uVar109;
  ushort uVar110;
  ushort uVar111;
  ushort uVar112;
  ushort uVar113;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  
  auVar80 = *(undefined1 (*) [16])(s + -(long)(p * 2));
  lVar78 = (long)p;
  auVar82 = *(undefined1 (*) [16])(s + -lVar78);
  auVar95 = *(undefined1 (*) [16])s;
  auVar98 = *(undefined1 (*) [16])(s + lVar78);
  auVar84 = psubusw(auVar95,auVar82);
  auVar93 = psubusw(auVar82,auVar95);
  auVar85 = psubusw(auVar98,auVar80);
  auVar96 = psubusw(auVar80,auVar98);
  auVar96 = auVar96 | auVar85;
  auVar85 = psubusw(auVar80,auVar82);
  auVar91 = psubusw(auVar82,auVar80);
  auVar91 = auVar91 | auVar85;
  auVar94 = psubusw(auVar98,auVar95);
  auVar86 = psubusw(auVar95,auVar98);
  auVar85 = *(undefined1 (*) [16])_blimit0;
  auVar87 = *(undefined1 (*) [16])_blimit1;
  auVar12[0xd] = 0;
  auVar12._0_13_ = auVar85._0_13_;
  auVar12[0xe] = auVar85[7];
  auVar18[0xc] = auVar85[6];
  auVar18._0_12_ = auVar85._0_12_;
  auVar18._13_2_ = auVar12._13_2_;
  auVar24[0xb] = 0;
  auVar24._0_11_ = auVar85._0_11_;
  auVar24._12_3_ = auVar18._12_3_;
  auVar30[10] = auVar85[5];
  auVar30._0_10_ = auVar85._0_10_;
  auVar30._11_4_ = auVar24._11_4_;
  auVar36[9] = 0;
  auVar36._0_9_ = auVar85._0_9_;
  auVar36._10_5_ = auVar30._10_5_;
  auVar42[8] = auVar85[4];
  auVar42._0_8_ = auVar85._0_8_;
  auVar42._9_6_ = auVar36._9_6_;
  auVar60._7_8_ = 0;
  auVar60._0_7_ = auVar42._8_7_;
  auVar66._1_8_ = SUB158(auVar60 << 0x40,7);
  auVar66[0] = auVar85[3];
  auVar66._9_6_ = 0;
  auVar67._1_10_ = SUB1510(auVar66 << 0x30,5);
  auVar67[0] = auVar85[2];
  auVar67._11_4_ = 0;
  auVar48[2] = auVar85[1];
  auVar48._0_2_ = auVar85._0_2_;
  auVar48._3_12_ = SUB1512(auVar67 << 0x20,3);
  auVar54._2_13_ = auVar48._2_13_;
  auVar54._0_2_ = auVar85._0_2_ & 0xff;
  auVar13[0xd] = 0;
  auVar13._0_13_ = auVar87._0_13_;
  auVar13[0xe] = auVar87[7];
  auVar19[0xc] = auVar87[6];
  auVar19._0_12_ = auVar87._0_12_;
  auVar19._13_2_ = auVar13._13_2_;
  auVar25[0xb] = 0;
  auVar25._0_11_ = auVar87._0_11_;
  auVar25._12_3_ = auVar19._12_3_;
  auVar31[10] = auVar87[5];
  auVar31._0_10_ = auVar87._0_10_;
  auVar31._11_4_ = auVar25._11_4_;
  auVar37[9] = 0;
  auVar37._0_9_ = auVar87._0_9_;
  auVar37._10_5_ = auVar31._10_5_;
  auVar43[8] = auVar87[4];
  auVar43._0_8_ = auVar87._0_8_;
  auVar43._9_6_ = auVar37._9_6_;
  auVar61._7_8_ = 0;
  auVar61._0_7_ = auVar43._8_7_;
  auVar68._1_8_ = SUB158(auVar61 << 0x40,7);
  auVar68[0] = auVar87[3];
  auVar68._9_6_ = 0;
  auVar69._1_10_ = SUB1510(auVar68 << 0x30,5);
  auVar69[0] = auVar87[2];
  auVar69._11_4_ = 0;
  auVar49[2] = auVar87[1];
  auVar49._0_2_ = auVar87._0_2_;
  auVar49._3_12_ = SUB1512(auVar69 << 0x20,3);
  auVar55._2_13_ = auVar49._2_13_;
  auVar55._0_2_ = auVar87._0_2_ & 0xff;
  auVar102._0_8_ = auVar54._0_8_;
  auVar102._8_8_ = auVar55._0_8_;
  auVar103 = ZEXT416(bd - 8);
  auVar99 = psllw(auVar102,auVar103);
  auVar86 = auVar86 | auVar94;
  auVar85 = *(undefined1 (*) [16])_limit0;
  auVar14[0xd] = 0;
  auVar14._0_13_ = auVar85._0_13_;
  auVar14[0xe] = auVar85[7];
  auVar20[0xc] = auVar85[6];
  auVar20._0_12_ = auVar85._0_12_;
  auVar20._13_2_ = auVar14._13_2_;
  auVar26[0xb] = 0;
  auVar26._0_11_ = auVar85._0_11_;
  auVar26._12_3_ = auVar20._12_3_;
  auVar32[10] = auVar85[5];
  auVar32._0_10_ = auVar85._0_10_;
  auVar32._11_4_ = auVar26._11_4_;
  auVar38[9] = 0;
  auVar38._0_9_ = auVar85._0_9_;
  auVar38._10_5_ = auVar32._10_5_;
  auVar44[8] = auVar85[4];
  auVar44._0_8_ = auVar85._0_8_;
  auVar44._9_6_ = auVar38._9_6_;
  auVar62._7_8_ = 0;
  auVar62._0_7_ = auVar44._8_7_;
  auVar70._1_8_ = SUB158(auVar62 << 0x40,7);
  auVar70[0] = auVar85[3];
  auVar70._9_6_ = 0;
  auVar71._1_10_ = SUB1510(auVar70 << 0x30,5);
  auVar71[0] = auVar85[2];
  auVar71._11_4_ = 0;
  auVar50[2] = auVar85[1];
  auVar50._0_2_ = auVar85._0_2_;
  auVar50._3_12_ = SUB1512(auVar71 << 0x20,3);
  auVar56._2_13_ = auVar50._2_13_;
  auVar56._0_2_ = auVar85._0_2_ & 0xff;
  auVar85 = *(undefined1 (*) [16])_limit1;
  auVar15[0xd] = 0;
  auVar15._0_13_ = auVar85._0_13_;
  auVar15[0xe] = auVar85[7];
  auVar21[0xc] = auVar85[6];
  auVar21._0_12_ = auVar85._0_12_;
  auVar21._13_2_ = auVar15._13_2_;
  auVar27[0xb] = 0;
  auVar27._0_11_ = auVar85._0_11_;
  auVar27._12_3_ = auVar21._12_3_;
  auVar33[10] = auVar85[5];
  auVar33._0_10_ = auVar85._0_10_;
  auVar33._11_4_ = auVar27._11_4_;
  auVar39[9] = 0;
  auVar39._0_9_ = auVar85._0_9_;
  auVar39._10_5_ = auVar33._10_5_;
  auVar45[8] = auVar85[4];
  auVar45._0_8_ = auVar85._0_8_;
  auVar45._9_6_ = auVar39._9_6_;
  auVar63._7_8_ = 0;
  auVar63._0_7_ = auVar45._8_7_;
  auVar72._1_8_ = SUB158(auVar63 << 0x40,7);
  auVar72[0] = auVar85[3];
  auVar72._9_6_ = 0;
  auVar73._1_10_ = SUB1510(auVar72 << 0x30,5);
  auVar73[0] = auVar85[2];
  auVar73._11_4_ = 0;
  auVar51[2] = auVar85[1];
  auVar51._0_2_ = auVar85._0_2_;
  auVar51._3_12_ = SUB1512(auVar73 << 0x20,3);
  auVar57._2_13_ = auVar51._2_13_;
  auVar57._0_2_ = auVar85._0_2_ & 0xff;
  auVar85._0_8_ = auVar56._0_8_;
  auVar85._8_8_ = auVar57._0_8_;
  auVar94 = psllw(auVar85,auVar103);
  sVar92 = auVar91._0_2_;
  sVar83 = auVar86._0_2_;
  auVar87._0_2_ = (ushort)(sVar83 < sVar92) * sVar92 | (ushort)(sVar83 >= sVar92) * sVar83;
  sVar92 = auVar91._2_2_;
  sVar83 = auVar86._2_2_;
  auVar87._2_2_ = (ushort)(sVar83 < sVar92) * sVar92 | (ushort)(sVar83 >= sVar92) * sVar83;
  sVar92 = auVar91._4_2_;
  sVar83 = auVar86._4_2_;
  auVar87._4_2_ = (ushort)(sVar83 < sVar92) * sVar92 | (ushort)(sVar83 >= sVar92) * sVar83;
  sVar92 = auVar91._6_2_;
  sVar83 = auVar86._6_2_;
  auVar87._6_2_ = (ushort)(sVar83 < sVar92) * sVar92 | (ushort)(sVar83 >= sVar92) * sVar83;
  sVar92 = auVar91._8_2_;
  sVar83 = auVar86._8_2_;
  auVar87._8_2_ = (ushort)(sVar83 < sVar92) * sVar92 | (ushort)(sVar83 >= sVar92) * sVar83;
  sVar92 = auVar91._10_2_;
  sVar83 = auVar86._10_2_;
  auVar87._10_2_ = (ushort)(sVar83 < sVar92) * sVar92 | (ushort)(sVar83 >= sVar92) * sVar83;
  sVar92 = auVar91._12_2_;
  sVar83 = auVar86._12_2_;
  sVar89 = auVar86._14_2_;
  auVar87._12_2_ = (ushort)(sVar83 < sVar92) * sVar92 | (ushort)(sVar83 >= sVar92) * sVar83;
  sVar92 = auVar91._14_2_;
  auVar87._14_2_ = (ushort)(sVar89 < sVar92) * sVar92 | (ushort)(sVar89 >= sVar92) * sVar89;
  auVar85 = *(undefined1 (*) [16])_thresh0;
  auVar16[0xd] = 0;
  auVar16._0_13_ = auVar85._0_13_;
  auVar16[0xe] = auVar85[7];
  auVar22[0xc] = auVar85[6];
  auVar22._0_12_ = auVar85._0_12_;
  auVar22._13_2_ = auVar16._13_2_;
  auVar28[0xb] = 0;
  auVar28._0_11_ = auVar85._0_11_;
  auVar28._12_3_ = auVar22._12_3_;
  auVar34[10] = auVar85[5];
  auVar34._0_10_ = auVar85._0_10_;
  auVar34._11_4_ = auVar28._11_4_;
  auVar40[9] = 0;
  auVar40._0_9_ = auVar85._0_9_;
  auVar40._10_5_ = auVar34._10_5_;
  auVar46[8] = auVar85[4];
  auVar46._0_8_ = auVar85._0_8_;
  auVar46._9_6_ = auVar40._9_6_;
  auVar64._7_8_ = 0;
  auVar64._0_7_ = auVar46._8_7_;
  auVar74._1_8_ = SUB158(auVar64 << 0x40,7);
  auVar74[0] = auVar85[3];
  auVar74._9_6_ = 0;
  auVar75._1_10_ = SUB1510(auVar74 << 0x30,5);
  auVar75[0] = auVar85[2];
  auVar75._11_4_ = 0;
  auVar52[2] = auVar85[1];
  auVar52._0_2_ = auVar85._0_2_;
  auVar52._3_12_ = SUB1512(auVar75 << 0x20,3);
  auVar58._2_13_ = auVar52._2_13_;
  auVar58._0_2_ = auVar85._0_2_ & 0xff;
  auVar85 = *(undefined1 (*) [16])_thresh1;
  auVar17[0xd] = 0;
  auVar17._0_13_ = auVar85._0_13_;
  auVar17[0xe] = auVar85[7];
  auVar23[0xc] = auVar85[6];
  auVar23._0_12_ = auVar85._0_12_;
  auVar23._13_2_ = auVar17._13_2_;
  auVar29[0xb] = 0;
  auVar29._0_11_ = auVar85._0_11_;
  auVar29._12_3_ = auVar23._12_3_;
  auVar35[10] = auVar85[5];
  auVar35._0_10_ = auVar85._0_10_;
  auVar35._11_4_ = auVar29._11_4_;
  auVar41[9] = 0;
  auVar41._0_9_ = auVar85._0_9_;
  auVar41._10_5_ = auVar35._10_5_;
  auVar47[8] = auVar85[4];
  auVar47._0_8_ = auVar85._0_8_;
  auVar47._9_6_ = auVar41._9_6_;
  auVar65._7_8_ = 0;
  auVar65._0_7_ = auVar47._8_7_;
  auVar76._1_8_ = SUB158(auVar65 << 0x40,7);
  auVar76[0] = auVar85[3];
  auVar76._9_6_ = 0;
  auVar77._1_10_ = SUB1510(auVar76 << 0x30,5);
  auVar77[0] = auVar85[2];
  auVar77._11_4_ = 0;
  auVar53[2] = auVar85[1];
  auVar53._0_2_ = auVar85._0_2_;
  auVar53._3_12_ = SUB1512(auVar77 << 0x20,3);
  auVar59._2_13_ = auVar53._2_13_;
  auVar59._0_2_ = auVar85._0_2_ & 0xff;
  auVar101._0_8_ = auVar58._0_8_;
  auVar101._8_8_ = auVar59._0_8_;
  auVar102 = psllw(auVar101,auVar103);
  auVar85 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar85 = pshuflw(auVar85,auVar85,0);
  auVar86._0_4_ = auVar85._0_4_;
  auVar86._4_4_ = auVar86._0_4_;
  auVar86._8_4_ = auVar86._0_4_;
  auVar86._12_4_ = auVar86._0_4_;
  auVar85 = paddusw(auVar93 | auVar84,auVar93 | auVar84);
  auVar103._0_2_ = auVar96._0_2_ >> 1;
  auVar103._2_2_ = auVar96._2_2_ >> 1;
  auVar103._4_2_ = auVar96._4_2_ >> 1;
  auVar103._6_2_ = auVar96._6_2_ >> 1;
  auVar103._8_2_ = auVar96._8_2_ >> 1;
  auVar103._10_2_ = auVar96._10_2_ >> 1;
  auVar103._12_2_ = auVar96._12_2_ >> 1;
  auVar103._14_2_ = auVar96._14_2_ >> 1;
  auVar85 = paddusw(auVar103,auVar85);
  auVar85 = auVar85 ^ _DAT_004df9f0;
  auVar99 = auVar99 ^ _DAT_004df9f0;
  auVar97._0_2_ = -(ushort)(auVar99._0_2_ < auVar85._0_2_);
  auVar97._2_2_ = -(ushort)(auVar99._2_2_ < auVar85._2_2_);
  auVar97._4_2_ = -(ushort)(auVar99._4_2_ < auVar85._4_2_);
  auVar97._6_2_ = -(ushort)(auVar99._6_2_ < auVar85._6_2_);
  auVar97._8_2_ = -(ushort)(auVar99._8_2_ < auVar85._8_2_);
  auVar97._10_2_ = -(ushort)(auVar99._10_2_ < auVar85._10_2_);
  auVar97._12_2_ = -(ushort)(auVar99._12_2_ < auVar85._12_2_);
  auVar97._14_2_ = -(ushort)(auVar99._14_2_ < auVar85._14_2_);
  auVar85 = paddusw(auVar94,_DAT_0051a5b0);
  auVar85 = auVar85 & auVar97;
  sVar92 = auVar85._0_2_;
  auVar91._0_2_ =
       (sVar92 < (short)auVar87._0_2_) * auVar87._0_2_ |
       (ushort)(sVar92 >= (short)auVar87._0_2_) * sVar92;
  sVar92 = auVar85._2_2_;
  auVar91._2_2_ =
       (sVar92 < (short)auVar87._2_2_) * auVar87._2_2_ |
       (ushort)(sVar92 >= (short)auVar87._2_2_) * sVar92;
  sVar92 = auVar85._4_2_;
  auVar91._4_2_ =
       (sVar92 < (short)auVar87._4_2_) * auVar87._4_2_ |
       (ushort)(sVar92 >= (short)auVar87._4_2_) * sVar92;
  sVar92 = auVar85._6_2_;
  auVar91._6_2_ =
       (sVar92 < (short)auVar87._6_2_) * auVar87._6_2_ |
       (ushort)(sVar92 >= (short)auVar87._6_2_) * sVar92;
  sVar92 = auVar85._8_2_;
  auVar91._8_2_ =
       (sVar92 < (short)auVar87._8_2_) * auVar87._8_2_ |
       (ushort)(sVar92 >= (short)auVar87._8_2_) * sVar92;
  sVar92 = auVar85._10_2_;
  auVar91._10_2_ =
       (sVar92 < (short)auVar87._10_2_) * auVar87._10_2_ |
       (ushort)(sVar92 >= (short)auVar87._10_2_) * sVar92;
  sVar92 = auVar85._12_2_;
  sVar83 = auVar85._14_2_;
  auVar91._12_2_ =
       (sVar92 < (short)auVar87._12_2_) * auVar87._12_2_ |
       (ushort)(sVar92 >= (short)auVar87._12_2_) * sVar92;
  auVar91._14_2_ =
       (sVar83 < (short)auVar87._14_2_) * auVar87._14_2_ |
       (ushort)(sVar83 >= (short)auVar87._14_2_) * sVar83;
  auVar84 = psubsw(auVar82,auVar86);
  auVar85 = psubsw(auVar80,auVar86);
  auVar80 = psubsw(auVar95,auVar86);
  auVar82 = psubsw(auVar98,auVar86);
  auVar95 = psllw(_DAT_0051a5b0,ZEXT416((uint)bd));
  auVar100._8_4_ = 0xffffffff;
  auVar100._0_8_ = 0xffffffffffffffff;
  auVar100._12_4_ = 0xffffffff;
  auVar95 = paddsw(auVar95,auVar100);
  auVar95 = psubsw(auVar95,auVar86);
  auVar98 = psubsw((undefined1  [16])0x0,auVar86);
  auVar93 = psubsw(auVar85,auVar82);
  sVar88 = auVar95._0_2_;
  sVar92 = auVar93._0_2_;
  uVar104 = (ushort)(sVar88 < sVar92) * sVar88 | (ushort)(sVar88 >= sVar92) * sVar92;
  sVar90 = auVar95._2_2_;
  sVar92 = auVar93._2_2_;
  uVar107 = (ushort)(sVar90 < sVar92) * sVar90 | (ushort)(sVar90 >= sVar92) * sVar92;
  sVar6 = auVar95._4_2_;
  sVar92 = auVar93._4_2_;
  uVar108 = (ushort)(sVar6 < sVar92) * sVar6 | (ushort)(sVar6 >= sVar92) * sVar92;
  sVar7 = auVar95._6_2_;
  sVar92 = auVar93._6_2_;
  uVar109 = (ushort)(sVar7 < sVar92) * sVar7 | (ushort)(sVar7 >= sVar92) * sVar92;
  sVar8 = auVar95._8_2_;
  sVar92 = auVar93._8_2_;
  uVar110 = (ushort)(sVar8 < sVar92) * sVar8 | (ushort)(sVar8 >= sVar92) * sVar92;
  sVar9 = auVar95._10_2_;
  sVar92 = auVar93._10_2_;
  uVar111 = (ushort)(sVar9 < sVar92) * sVar9 | (ushort)(sVar9 >= sVar92) * sVar92;
  sVar10 = auVar95._12_2_;
  sVar92 = auVar93._12_2_;
  sVar83 = auVar93._14_2_;
  uVar112 = (ushort)(sVar10 < sVar92) * sVar10 | (ushort)(sVar10 >= sVar92) * sVar92;
  sVar11 = auVar95._14_2_;
  uVar113 = (ushort)(sVar11 < sVar83) * sVar11 | (ushort)(sVar11 >= sVar83) * sVar83;
  sVar92 = auVar98._0_2_;
  auVar105._0_2_ = (ushort)((short)uVar104 < sVar92) * sVar92 | ((short)uVar104 >= sVar92) * uVar104
  ;
  sVar83 = auVar98._2_2_;
  auVar105._2_2_ = (ushort)((short)uVar107 < sVar83) * sVar83 | ((short)uVar107 >= sVar83) * uVar107
  ;
  sVar89 = auVar98._4_2_;
  auVar105._4_2_ = (ushort)((short)uVar108 < sVar89) * sVar89 | ((short)uVar108 >= sVar89) * uVar108
  ;
  sVar1 = auVar98._6_2_;
  auVar105._6_2_ = (ushort)((short)uVar109 < sVar1) * sVar1 | ((short)uVar109 >= sVar1) * uVar109;
  sVar2 = auVar98._8_2_;
  auVar105._8_2_ = (ushort)((short)uVar110 < sVar2) * sVar2 | ((short)uVar110 >= sVar2) * uVar110;
  sVar3 = auVar98._10_2_;
  auVar105._10_2_ = (ushort)((short)uVar111 < sVar3) * sVar3 | ((short)uVar111 >= sVar3) * uVar111;
  sVar4 = auVar98._12_2_;
  auVar105._12_2_ = (ushort)((short)uVar112 < sVar4) * sVar4 | ((short)uVar112 >= sVar4) * uVar112;
  sVar5 = auVar98._14_2_;
  auVar105._14_2_ = (ushort)((short)uVar113 < sVar5) * sVar5 | ((short)uVar113 >= sVar5) * uVar113;
  auVar87 = auVar87 ^ _DAT_004df9f0;
  auVar102 = auVar102 ^ _DAT_004df9f0;
  auVar95._0_2_ = -(ushort)(auVar102._0_2_ < auVar87._0_2_);
  auVar95._2_2_ = -(ushort)(auVar102._2_2_ < auVar87._2_2_);
  auVar95._4_2_ = -(ushort)(auVar102._4_2_ < auVar87._4_2_);
  auVar95._6_2_ = -(ushort)(auVar102._6_2_ < auVar87._6_2_);
  auVar95._8_2_ = -(ushort)(auVar102._8_2_ < auVar87._8_2_);
  auVar95._10_2_ = -(ushort)(auVar102._10_2_ < auVar87._10_2_);
  auVar95._12_2_ = -(ushort)(auVar102._12_2_ < auVar87._12_2_);
  auVar95._14_2_ = -(ushort)(auVar102._14_2_ < auVar87._14_2_);
  auVar98 = psubsw(auVar80,auVar84);
  auVar87 = paddsw(auVar105 & auVar95,auVar98);
  auVar87 = paddsw(auVar87,auVar98);
  auVar98 = paddsw(auVar87,auVar98);
  sVar79 = auVar98._0_2_;
  uVar104 = (ushort)(sVar88 < sVar79) * sVar88 | (ushort)(sVar88 >= sVar79) * sVar79;
  sVar79 = auVar98._2_2_;
  uVar107 = (ushort)(sVar90 < sVar79) * sVar90 | (ushort)(sVar90 >= sVar79) * sVar79;
  sVar79 = auVar98._4_2_;
  uVar108 = (ushort)(sVar6 < sVar79) * sVar6 | (ushort)(sVar6 >= sVar79) * sVar79;
  sVar79 = auVar98._6_2_;
  uVar109 = (ushort)(sVar7 < sVar79) * sVar7 | (ushort)(sVar7 >= sVar79) * sVar79;
  sVar79 = auVar98._8_2_;
  uVar110 = (ushort)(sVar8 < sVar79) * sVar8 | (ushort)(sVar8 >= sVar79) * sVar79;
  sVar79 = auVar98._10_2_;
  uVar111 = (ushort)(sVar9 < sVar79) * sVar9 | (ushort)(sVar9 >= sVar79) * sVar79;
  sVar79 = auVar98._12_2_;
  sVar81 = auVar98._14_2_;
  uVar112 = (ushort)(sVar10 < sVar79) * sVar10 | (ushort)(sVar10 >= sVar79) * sVar79;
  uVar113 = (ushort)(sVar11 < sVar81) * sVar11 | (ushort)(sVar11 >= sVar81) * sVar81;
  auVar106._0_2_ = (ushort)((short)uVar104 < sVar92) * sVar92 | ((short)uVar104 >= sVar92) * uVar104
  ;
  auVar106._2_2_ = (ushort)((short)uVar107 < sVar83) * sVar83 | ((short)uVar107 >= sVar83) * uVar107
  ;
  auVar106._4_2_ = (ushort)((short)uVar108 < sVar89) * sVar89 | ((short)uVar108 >= sVar89) * uVar108
  ;
  auVar106._6_2_ = (ushort)((short)uVar109 < sVar1) * sVar1 | ((short)uVar109 >= sVar1) * uVar109;
  auVar106._8_2_ = (ushort)((short)uVar110 < sVar2) * sVar2 | ((short)uVar110 >= sVar2) * uVar110;
  auVar106._10_2_ = (ushort)((short)uVar111 < sVar3) * sVar3 | ((short)uVar111 >= sVar3) * uVar111;
  auVar106._12_2_ = (ushort)((short)uVar112 < sVar4) * sVar4 | ((short)uVar112 >= sVar4) * uVar112;
  auVar106._14_2_ = (ushort)((short)uVar113 < sVar5) * sVar5 | ((short)uVar113 >= sVar5) * uVar113;
  auVar98 = psubusw(auVar91,auVar94);
  auVar93._0_2_ = -(ushort)(auVar98._0_2_ == 0);
  auVar93._2_2_ = -(ushort)(auVar98._2_2_ == 0);
  auVar93._4_2_ = -(ushort)(auVar98._4_2_ == 0);
  auVar93._6_2_ = -(ushort)(auVar98._6_2_ == 0);
  auVar93._8_2_ = -(ushort)(auVar98._8_2_ == 0);
  auVar93._10_2_ = -(ushort)(auVar98._10_2_ == 0);
  auVar93._12_2_ = -(ushort)(auVar98._12_2_ == 0);
  auVar93._14_2_ = -(ushort)(auVar98._14_2_ == 0);
  auVar87 = paddsw(_DAT_0050e770,auVar93 & auVar106);
  auVar98 = paddsw(auVar93 & auVar106,_DAT_0051a5d0);
  sVar79 = auVar87._0_2_;
  uVar104 = (ushort)(sVar88 < sVar79) * sVar88 | (ushort)(sVar88 >= sVar79) * sVar79;
  sVar79 = auVar87._2_2_;
  uVar107 = (ushort)(sVar90 < sVar79) * sVar90 | (ushort)(sVar90 >= sVar79) * sVar79;
  sVar79 = auVar87._4_2_;
  uVar108 = (ushort)(sVar6 < sVar79) * sVar6 | (ushort)(sVar6 >= sVar79) * sVar79;
  sVar79 = auVar87._6_2_;
  uVar109 = (ushort)(sVar7 < sVar79) * sVar7 | (ushort)(sVar7 >= sVar79) * sVar79;
  sVar79 = auVar87._8_2_;
  uVar110 = (ushort)(sVar8 < sVar79) * sVar8 | (ushort)(sVar8 >= sVar79) * sVar79;
  sVar79 = auVar87._10_2_;
  uVar111 = (ushort)(sVar9 < sVar79) * sVar9 | (ushort)(sVar9 >= sVar79) * sVar79;
  sVar79 = auVar87._12_2_;
  sVar81 = auVar87._14_2_;
  uVar112 = (ushort)(sVar10 < sVar79) * sVar10 | (ushort)(sVar10 >= sVar79) * sVar79;
  uVar113 = (ushort)(sVar11 < sVar81) * sVar11 | (ushort)(sVar11 >= sVar81) * sVar81;
  auVar96._0_2_ = (ushort)((short)uVar104 < sVar92) * sVar92 | ((short)uVar104 >= sVar92) * uVar104;
  auVar96._2_2_ = (ushort)((short)uVar107 < sVar83) * sVar83 | ((short)uVar107 >= sVar83) * uVar107;
  auVar96._4_2_ = (ushort)((short)uVar108 < sVar89) * sVar89 | ((short)uVar108 >= sVar89) * uVar108;
  auVar96._6_2_ = (ushort)((short)uVar109 < sVar1) * sVar1 | ((short)uVar109 >= sVar1) * uVar109;
  auVar96._8_2_ = (ushort)((short)uVar110 < sVar2) * sVar2 | ((short)uVar110 >= sVar2) * uVar110;
  auVar96._10_2_ = (ushort)((short)uVar111 < sVar3) * sVar3 | ((short)uVar111 >= sVar3) * uVar111;
  auVar96._12_2_ = (ushort)((short)uVar112 < sVar4) * sVar4 | ((short)uVar112 >= sVar4) * uVar112;
  auVar96._14_2_ = (ushort)((short)uVar113 < sVar5) * sVar5 | ((short)uVar113 >= sVar5) * uVar113;
  sVar79 = auVar98._0_2_;
  uVar104 = (ushort)(sVar88 < sVar79) * sVar88 | (ushort)(sVar88 >= sVar79) * sVar79;
  sVar79 = auVar98._2_2_;
  uVar107 = (ushort)(sVar90 < sVar79) * sVar90 | (ushort)(sVar90 >= sVar79) * sVar79;
  sVar79 = auVar98._4_2_;
  uVar108 = (ushort)(sVar6 < sVar79) * sVar6 | (ushort)(sVar6 >= sVar79) * sVar79;
  sVar79 = auVar98._6_2_;
  uVar109 = (ushort)(sVar7 < sVar79) * sVar7 | (ushort)(sVar7 >= sVar79) * sVar79;
  sVar79 = auVar98._8_2_;
  uVar110 = (ushort)(sVar8 < sVar79) * sVar8 | (ushort)(sVar8 >= sVar79) * sVar79;
  sVar79 = auVar98._10_2_;
  uVar111 = (ushort)(sVar9 < sVar79) * sVar9 | (ushort)(sVar9 >= sVar79) * sVar79;
  sVar79 = auVar98._12_2_;
  sVar81 = auVar98._14_2_;
  uVar112 = (ushort)(sVar10 < sVar79) * sVar10 | (ushort)(sVar10 >= sVar79) * sVar79;
  uVar113 = (ushort)(sVar11 < sVar81) * sVar11 | (ushort)(sVar11 >= sVar81) * sVar81;
  auVar94._0_2_ = (ushort)((short)uVar104 < sVar92) * sVar92 | ((short)uVar104 >= sVar92) * uVar104;
  auVar94._2_2_ = (ushort)((short)uVar107 < sVar83) * sVar83 | ((short)uVar107 >= sVar83) * uVar107;
  auVar94._4_2_ = (ushort)((short)uVar108 < sVar89) * sVar89 | ((short)uVar108 >= sVar89) * uVar108;
  auVar94._6_2_ = (ushort)((short)uVar109 < sVar1) * sVar1 | ((short)uVar109 >= sVar1) * uVar109;
  auVar94._8_2_ = (ushort)((short)uVar110 < sVar2) * sVar2 | ((short)uVar110 >= sVar2) * uVar110;
  auVar94._10_2_ = (ushort)((short)uVar111 < sVar3) * sVar3 | ((short)uVar111 >= sVar3) * uVar111;
  auVar94._12_2_ = (ushort)((short)uVar112 < sVar4) * sVar4 | ((short)uVar112 >= sVar4) * uVar112;
  auVar94._14_2_ = (ushort)((short)uVar113 < sVar5) * sVar5 | ((short)uVar113 >= sVar5) * uVar113;
  auVar91 = psraw(auVar96,3);
  auVar98 = psraw(auVar94,3);
  auVar80 = psubsw(auVar80,auVar91);
  sVar79 = auVar80._0_2_;
  uVar104 = (ushort)(sVar88 < sVar79) * sVar88 | (ushort)(sVar88 >= sVar79) * sVar79;
  sVar79 = auVar80._2_2_;
  uVar107 = (ushort)(sVar90 < sVar79) * sVar90 | (ushort)(sVar90 >= sVar79) * sVar79;
  sVar79 = auVar80._4_2_;
  uVar108 = (ushort)(sVar6 < sVar79) * sVar6 | (ushort)(sVar6 >= sVar79) * sVar79;
  sVar79 = auVar80._6_2_;
  uVar109 = (ushort)(sVar7 < sVar79) * sVar7 | (ushort)(sVar7 >= sVar79) * sVar79;
  sVar79 = auVar80._8_2_;
  uVar110 = (ushort)(sVar8 < sVar79) * sVar8 | (ushort)(sVar8 >= sVar79) * sVar79;
  sVar79 = auVar80._10_2_;
  uVar111 = (ushort)(sVar9 < sVar79) * sVar9 | (ushort)(sVar9 >= sVar79) * sVar79;
  sVar79 = auVar80._12_2_;
  sVar81 = auVar80._14_2_;
  uVar112 = (ushort)(sVar10 < sVar79) * sVar10 | (ushort)(sVar10 >= sVar79) * sVar79;
  uVar113 = (ushort)(sVar11 < sVar81) * sVar11 | (ushort)(sVar11 >= sVar81) * sVar81;
  auVar80._0_2_ = (ushort)((short)uVar104 < sVar92) * sVar92 | ((short)uVar104 >= sVar92) * uVar104;
  auVar80._2_2_ = (ushort)((short)uVar107 < sVar83) * sVar83 | ((short)uVar107 >= sVar83) * uVar107;
  auVar80._4_2_ = (ushort)((short)uVar108 < sVar89) * sVar89 | ((short)uVar108 >= sVar89) * uVar108;
  auVar80._6_2_ = (ushort)((short)uVar109 < sVar1) * sVar1 | ((short)uVar109 >= sVar1) * uVar109;
  auVar80._8_2_ = (ushort)((short)uVar110 < sVar2) * sVar2 | ((short)uVar110 >= sVar2) * uVar110;
  auVar80._10_2_ = (ushort)((short)uVar111 < sVar3) * sVar3 | ((short)uVar111 >= sVar3) * uVar111;
  auVar80._12_2_ = (ushort)((short)uVar112 < sVar4) * sVar4 | ((short)uVar112 >= sVar4) * uVar112;
  auVar80._14_2_ = (ushort)((short)uVar113 < sVar5) * sVar5 | ((short)uVar113 >= sVar5) * uVar113;
  auVar98 = paddsw(auVar98,auVar84);
  sVar79 = auVar98._0_2_;
  uVar104 = (ushort)(sVar88 < sVar79) * sVar88 | (ushort)(sVar88 >= sVar79) * sVar79;
  sVar79 = auVar98._2_2_;
  uVar107 = (ushort)(sVar90 < sVar79) * sVar90 | (ushort)(sVar90 >= sVar79) * sVar79;
  sVar79 = auVar98._4_2_;
  uVar108 = (ushort)(sVar6 < sVar79) * sVar6 | (ushort)(sVar6 >= sVar79) * sVar79;
  sVar79 = auVar98._6_2_;
  uVar109 = (ushort)(sVar7 < sVar79) * sVar7 | (ushort)(sVar7 >= sVar79) * sVar79;
  sVar79 = auVar98._8_2_;
  uVar110 = (ushort)(sVar8 < sVar79) * sVar8 | (ushort)(sVar8 >= sVar79) * sVar79;
  sVar79 = auVar98._10_2_;
  uVar111 = (ushort)(sVar9 < sVar79) * sVar9 | (ushort)(sVar9 >= sVar79) * sVar79;
  sVar79 = auVar98._12_2_;
  sVar81 = auVar98._14_2_;
  uVar112 = (ushort)(sVar10 < sVar79) * sVar10 | (ushort)(sVar10 >= sVar79) * sVar79;
  uVar113 = (ushort)(sVar11 < sVar81) * sVar11 | (ushort)(sVar11 >= sVar81) * sVar81;
  auVar84._0_2_ = (ushort)((short)uVar104 < sVar92) * sVar92 | ((short)uVar104 >= sVar92) * uVar104;
  auVar84._2_2_ = (ushort)((short)uVar107 < sVar83) * sVar83 | ((short)uVar107 >= sVar83) * uVar107;
  auVar84._4_2_ = (ushort)((short)uVar108 < sVar89) * sVar89 | ((short)uVar108 >= sVar89) * uVar108;
  auVar84._6_2_ = (ushort)((short)uVar109 < sVar1) * sVar1 | ((short)uVar109 >= sVar1) * uVar109;
  auVar84._8_2_ = (ushort)((short)uVar110 < sVar2) * sVar2 | ((short)uVar110 >= sVar2) * uVar110;
  auVar84._10_2_ = (ushort)((short)uVar111 < sVar3) * sVar3 | ((short)uVar111 >= sVar3) * uVar111;
  auVar84._12_2_ = (ushort)((short)uVar112 < sVar4) * sVar4 | ((short)uVar112 >= sVar4) * uVar112;
  auVar84._14_2_ = (ushort)((short)uVar113 < sVar5) * sVar5 | ((short)uVar113 >= sVar5) * uVar113;
  auVar80 = paddsw(auVar80,auVar86);
  auVar87 = paddsw(auVar84,auVar86);
  auVar99._0_2_ = auVar91._0_2_ + 1;
  auVar99._2_2_ = auVar91._2_2_ + 1;
  auVar99._4_2_ = auVar91._4_2_ + 1;
  auVar99._6_2_ = auVar91._6_2_ + 1;
  auVar99._8_2_ = auVar91._8_2_ + 1;
  auVar99._10_2_ = auVar91._10_2_ + 1;
  auVar99._12_2_ = auVar91._12_2_ + 1;
  auVar99._14_2_ = auVar91._14_2_ + 1;
  auVar98 = psraw(auVar99,1);
  auVar82 = psubsw(auVar82,~auVar95 & auVar98);
  sVar79 = auVar82._0_2_;
  uVar104 = (ushort)(sVar88 < sVar79) * sVar88 | (ushort)(sVar88 >= sVar79) * sVar79;
  sVar79 = auVar82._2_2_;
  uVar107 = (ushort)(sVar90 < sVar79) * sVar90 | (ushort)(sVar90 >= sVar79) * sVar79;
  sVar79 = auVar82._4_2_;
  uVar108 = (ushort)(sVar6 < sVar79) * sVar6 | (ushort)(sVar6 >= sVar79) * sVar79;
  sVar79 = auVar82._6_2_;
  uVar109 = (ushort)(sVar7 < sVar79) * sVar7 | (ushort)(sVar7 >= sVar79) * sVar79;
  sVar79 = auVar82._8_2_;
  uVar110 = (ushort)(sVar8 < sVar79) * sVar8 | (ushort)(sVar8 >= sVar79) * sVar79;
  sVar79 = auVar82._10_2_;
  uVar111 = (ushort)(sVar9 < sVar79) * sVar9 | (ushort)(sVar9 >= sVar79) * sVar79;
  sVar79 = auVar82._12_2_;
  sVar81 = auVar82._14_2_;
  uVar112 = (ushort)(sVar10 < sVar79) * sVar10 | (ushort)(sVar10 >= sVar79) * sVar79;
  uVar113 = (ushort)(sVar11 < sVar81) * sVar11 | (ushort)(sVar11 >= sVar81) * sVar81;
  auVar82._0_2_ = (ushort)((short)uVar104 < sVar92) * sVar92 | ((short)uVar104 >= sVar92) * uVar104;
  auVar82._2_2_ = (ushort)((short)uVar107 < sVar83) * sVar83 | ((short)uVar107 >= sVar83) * uVar107;
  auVar82._4_2_ = (ushort)((short)uVar108 < sVar89) * sVar89 | ((short)uVar108 >= sVar89) * uVar108;
  auVar82._6_2_ = (ushort)((short)uVar109 < sVar1) * sVar1 | ((short)uVar109 >= sVar1) * uVar109;
  auVar82._8_2_ = (ushort)((short)uVar110 < sVar2) * sVar2 | ((short)uVar110 >= sVar2) * uVar110;
  auVar82._10_2_ = (ushort)((short)uVar111 < sVar3) * sVar3 | ((short)uVar111 >= sVar3) * uVar111;
  auVar82._12_2_ = (ushort)((short)uVar112 < sVar4) * sVar4 | ((short)uVar112 >= sVar4) * uVar112;
  auVar82._14_2_ = (ushort)((short)uVar113 < sVar5) * sVar5 | ((short)uVar113 >= sVar5) * uVar113;
  auVar95 = paddsw(~auVar95 & auVar98,auVar85);
  sVar79 = auVar95._0_2_;
  uVar104 = (ushort)(sVar88 < sVar79) * sVar88 | (ushort)(sVar88 >= sVar79) * sVar79;
  sVar88 = auVar95._2_2_;
  uVar107 = (ushort)(sVar90 < sVar88) * sVar90 | (ushort)(sVar90 >= sVar88) * sVar88;
  sVar88 = auVar95._4_2_;
  uVar108 = (ushort)(sVar6 < sVar88) * sVar6 | (ushort)(sVar6 >= sVar88) * sVar88;
  sVar88 = auVar95._6_2_;
  uVar109 = (ushort)(sVar7 < sVar88) * sVar7 | (ushort)(sVar7 >= sVar88) * sVar88;
  sVar88 = auVar95._8_2_;
  uVar110 = (ushort)(sVar8 < sVar88) * sVar8 | (ushort)(sVar8 >= sVar88) * sVar88;
  sVar88 = auVar95._10_2_;
  uVar111 = (ushort)(sVar9 < sVar88) * sVar9 | (ushort)(sVar9 >= sVar88) * sVar88;
  sVar88 = auVar95._12_2_;
  sVar90 = auVar95._14_2_;
  uVar112 = (ushort)(sVar10 < sVar88) * sVar10 | (ushort)(sVar10 >= sVar88) * sVar88;
  uVar113 = (ushort)(sVar11 < sVar90) * sVar11 | (ushort)(sVar11 >= sVar90) * sVar90;
  auVar98._0_2_ = (ushort)((short)uVar104 < sVar92) * sVar92 | ((short)uVar104 >= sVar92) * uVar104;
  auVar98._2_2_ = (ushort)((short)uVar107 < sVar83) * sVar83 | ((short)uVar107 >= sVar83) * uVar107;
  auVar98._4_2_ = (ushort)((short)uVar108 < sVar89) * sVar89 | ((short)uVar108 >= sVar89) * uVar108;
  auVar98._6_2_ = (ushort)((short)uVar109 < sVar1) * sVar1 | ((short)uVar109 >= sVar1) * uVar109;
  auVar98._8_2_ = (ushort)((short)uVar110 < sVar2) * sVar2 | ((short)uVar110 >= sVar2) * uVar110;
  auVar98._10_2_ = (ushort)((short)uVar111 < sVar3) * sVar3 | ((short)uVar111 >= sVar3) * uVar111;
  auVar98._12_2_ = (ushort)((short)uVar112 < sVar4) * sVar4 | ((short)uVar112 >= sVar4) * uVar112;
  auVar98._14_2_ = (ushort)((short)uVar113 < sVar5) * sVar5 | ((short)uVar113 >= sVar5) * uVar113;
  auVar82 = paddsw(auVar82,auVar86);
  auVar95 = paddsw(auVar98,auVar86);
  *(undefined1 (*) [16])(s + -(long)(p * 2)) = auVar95;
  *(undefined1 (*) [16])(s + -lVar78) = auVar87;
  *(undefined1 (*) [16])s = auVar80;
  *(undefined1 (*) [16])(s + lVar78) = auVar82;
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_4_dual_sse2(
    uint16_t *s, int p, const uint8_t *_blimit0, const uint8_t *_limit0,
    const uint8_t *_thresh0, const uint8_t *_blimit1, const uint8_t *_limit1,
    const uint8_t *_thresh1, int bd) {
  __m128i p1 = _mm_loadu_si128((__m128i *)(s - 2 * p));
  __m128i p0 = _mm_loadu_si128((__m128i *)(s - 1 * p));
  __m128i q0 = _mm_loadu_si128((__m128i *)(s - 0 * p));
  __m128i q1 = _mm_loadu_si128((__m128i *)(s + 1 * p));
  __m128i ps[2], qs[2];

  highbd_lpf_internal_4_dual_sse2(&p1, &p0, &q0, &q1, ps, qs, _blimit0, _limit0,
                                  _thresh0, _blimit1, _limit1, _thresh1, bd);

  _mm_storeu_si128((__m128i *)(s - 2 * p), ps[1]);
  _mm_storeu_si128((__m128i *)(s - 1 * p), ps[0]);
  _mm_storeu_si128((__m128i *)(s + 0 * p), qs[0]);
  _mm_storeu_si128((__m128i *)(s + 1 * p), qs[1]);
}